

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O3

void __thiscall pg::TLQSolver::TLQSolver(TLQSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [16];
  bitset bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  undefined1 auVar5 [32];
  
  Solver::Solver(&this->super_Solver,oink,game);
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__TLQSolver_001b1c18;
  (this->pea_S).pointer = 0;
  (this->pea_S).queue = (uint *)0x0;
  this->pea_root = (bitset)ZEXT1632(auVar1);
  *(undefined1 (*) [32])&this->iterations = ZEXT1632(auVar1);
  (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = (bitset)ZEXT1632(auVar1);
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)bVar2._bits;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)bVar2._size;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bVar2._bitssize;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)bVar2._allocsize;
  *(bitset *)
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start + 4) = bVar2;
  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)bVar2._bits;
  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)bVar2._size;
  (this->tangle).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bVar2._bitssize;
  (this->tangleto).queue = (uint *)bVar2._allocsize;
  (this->tangleto).pointer = 0;
  this->escapes = bVar2;
  *(undefined1 (*) [32])((long)&(this->escapes)._size + 4) = ZEXT1632(auVar1);
  auVar4 = ZEXT464(0) << 0x40;
  this->Rs = (vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>)auVar4._0_24_;
  this->Hs = (vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>)auVar4._24_24_;
  (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)auVar4._48_8_;
  (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)auVar4._56_8_;
  auVar3 = auVar4._0_32_;
  auVar5 = auVar4._32_32_;
  (this->G)._bits = (uint64_t *)auVar3._0_8_;
  (this->G)._size = auVar3._8_8_;
  (this->G)._bitssize = auVar3._16_8_;
  (this->G)._allocsize = auVar3._24_8_;
  (this->S)._bits = (uint64_t *)auVar5._0_8_;
  (this->S)._size = auVar5._8_8_;
  (this->S)._bitssize = auVar5._16_8_;
  (this->S)._allocsize = auVar5._24_8_;
  *(undefined1 (*) [64])
   &(this->Hs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar4;
  auVar3 = auVar4._0_32_;
  auVar5 = auVar4._32_32_;
  (this->W0)._bits = (uint64_t *)auVar3._0_8_;
  (this->W0)._size = auVar3._8_8_;
  (this->W0)._bitssize = auVar3._16_8_;
  (this->W0)._allocsize = auVar3._24_8_;
  (this->W1)._bits = (uint64_t *)auVar5._0_8_;
  (this->W1)._size = auVar5._8_8_;
  (this->W1)._bitssize = auVar5._16_8_;
  (this->W1)._allocsize = auVar5._24_8_;
  return;
}

Assistant:

TLQSolver::TLQSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}